

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

int64_t absl::lts_20250127::anon_unknown_8::FloorToUnit(Duration d,Duration unit)

{
  Duration lhs;
  bool bVar1;
  long lVar2;
  Duration rhs;
  int64_t local_f0;
  int64_t q;
  Duration rem;
  Duration unit_local;
  Duration d_local;
  
  rem._4_8_ = unit.rep_hi_;
  Duration::Duration((Duration *)((long)&q + 4));
  local_f0 = IDivDuration(d,unit,(Duration *)((long)&q + 4));
  if (local_f0 < 1) {
    rhs = ZeroDuration();
    lhs.rep_lo_ = rem.rep_hi_.lo_;
    lhs.rep_hi_ = stack0xffffffffffffffb4;
    bVar1 = operator>=(lhs,rhs);
    if ((!bVar1) && (lVar2 = std::numeric_limits<long>::min(), local_f0 != lVar2)) {
      local_f0 = local_f0 + -1;
    }
  }
  return local_f0;
}

Assistant:

inline int64_t FloorToUnit(absl::Duration d, absl::Duration unit) {
  absl::Duration rem;
  int64_t q = absl::IDivDuration(d, unit, &rem);
  return (q > 0 || rem >= ZeroDuration() ||
          q == std::numeric_limits<int64_t>::min())
             ? q
             : q - 1;
}